

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_P2pkhAddress_Test::TestBody
          (ElementsConfidentialAddress_P2pkhAddress_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_1698;
  Message local_1690;
  string local_1688;
  string local_1668;
  undefined1 local_1648 [8];
  AssertionResult gtest_ar_14;
  ElementsConfidentialAddress ca;
  Message local_1478 [2];
  CfdException *anon_var_0;
  byte local_12a9;
  char *pcStack_12a8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_1298;
  undefined1 local_1278 [8];
  ConfidentialKey uc_key;
  Message local_1258;
  Script local_1250;
  string local_1218;
  undefined1 local_11f8 [8];
  AssertionResult gtest_ar_13;
  Message local_11e0;
  ElementsAddressType local_11d8;
  AddressType local_11d4;
  undefined1 local_11d0 [8];
  AssertionResult gtest_ar_12;
  Message local_11b8;
  ElementsNetType local_11b0;
  NetType local_11ac;
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_1178;
  Message local_1170;
  string local_1168;
  bool local_1141;
  undefined1 local_1140 [8];
  AssertionResult gtest_ar__1;
  Message local_1128;
  Address local_1120;
  string local_fa0;
  undefined1 local_f80 [8];
  AssertionResult gtest_ar_10;
  Message local_f68;
  ByteData local_f60;
  string local_f48;
  undefined1 local_f28 [8];
  AssertionResult gtest_ar_9;
  Message local_f10;
  ConfidentialKey local_f08;
  string local_ef0;
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar_8;
  Message local_eb8;
  string local_eb0;
  undefined1 local_e90 [8];
  AssertionResult gtest_ar_7;
  Message local_e78;
  ElementsConfidentialAddress local_e70;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_cb8;
  Address local_ca0;
  AssertHelper local_b20;
  Message local_b18;
  Script local_b10;
  string local_ad8;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar_6;
  Message local_aa0;
  ElementsAddressType local_a98;
  AddressType local_a94;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar_5;
  Message local_a78;
  ElementsNetType local_a70;
  NetType local_a6c;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_a38;
  Message local_a30;
  string local_a28;
  bool local_a01;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar_;
  Message local_9e8;
  Address local_9e0;
  string local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_3;
  Message local_828;
  ByteData local_820;
  string local_808;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_2;
  Message local_7d0;
  ConfidentialKey local_7c8;
  string local_7b0;
  undefined1 local_790 [8];
  AssertionResult gtest_ar_1;
  Message local_778;
  string local_770;
  undefined1 local_750 [8];
  AssertionResult gtest_ar;
  Message local_738 [2];
  ElementsConfidentialAddress local_728;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_570;
  Address local_558;
  undefined1 local_3d8 [8];
  Address unblind_addr;
  ElementsConfidentialAddress address;
  string local_98;
  undefined1 local_78 [8];
  ConfidentialKey key;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey pubkey;
  ElementsConfidentialAddress_P2pkhAddress_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
             (allocator *)(address.address_.field_2._M_local_buf + 0xf));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(address.address_.field_2._M_local_buf + 0xf))
  ;
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::Address((Address *)local_3d8);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&local_558,kCfdOutOfRangeError,(Pubkey *)local_28,&local_570);
  cfd::core::Address::operator=((Address *)local_3d8,&local_558);
  cfd::core::Address::~Address(&local_558);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_570);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                (&local_728,(Address *)local_3d8,(ConfidentialKey *)local_78);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)
                 &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_728);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_728);
    }
  }
  else {
    testing::Message::Message(local_738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x38,
               "Expected: (address = ElementsConfidentialAddress(unblind_addr, key)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_738);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_770,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_750,
             "\"VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w\"",
             "address.GetAddress().c_str()",
             "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w",
             pcVar2);
  std::__cxx11::string::~string((string *)&local_770);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(&local_778);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            (&local_7c8,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_7b0,&local_7c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_790,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",pcVar2);
  std::__cxx11::string::~string((string *)&local_7b0);
  cfd::core::Pubkey::~Pubkey(&local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_790);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  cfd::core::ElementsConfidentialAddress::GetHash
            (&local_820,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_808,&local_820);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7e8,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_808);
  cfd::core::ByteData::~ByteData(&local_820);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            (&local_9e0,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_860,&local_9e0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_840,"\"QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ",pcVar2);
  std::__cxx11::string::~string((string *)&local_860);
  cfd::core::Address::~Address(&local_9e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_9e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_a28,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_a01 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_a28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a00,&local_a01,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
  if (!bVar1) {
    testing::Message::Message(&local_a30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_a00,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a38,&local_a30);
    testing::internal::AssertHelper::~AssertHelper(&local_a38);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
  local_a6c = kLiquidV1;
  local_a70 = cfd::core::ElementsConfidentialAddress::GetNetType
                        ((ElementsConfidentialAddress *)
                         &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_a68,"ElementsNetType::kLiquidV1","address.GetNetType()",
             &local_a6c,&local_a70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar1) {
    testing::Message::Message(&local_a78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_a78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  local_a94 = kP2pkhAddress;
  local_a98 = cfd::core::ElementsConfidentialAddress::GetAddressType
                        ((ElementsConfidentialAddress *)
                         &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_a90,"ElementsAddressType::kP2pkhAddress",
             "address.GetAddressType()",&local_a94,&local_a98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
  if (!bVar1) {
    testing::Message::Message(&local_aa0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
  cfd::core::ElementsConfidentialAddress::GetLockingScript
            (&local_b10,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Script::GetHex_abi_cxx11_(&local_ad8,&local_b10);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ab8,"\"76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac\"",
             "address.GetLockingScript().GetHex().c_str()",
             "76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",pcVar2);
  std::__cxx11::string::~string((string *)&local_ad8);
  cfd::core::Script::~Script(&local_b10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar1) {
    testing::Message::Message(&local_b18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ab8);
    testing::internal::AssertHelper::AssertHelper
              (&local_b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b20,&local_b18);
    testing::internal::AssertHelper::~AssertHelper(&local_b20);
    testing::Message::~Message(&local_b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&local_ca0,kCfdInvalidSettingError,(Pubkey *)local_28,&local_cb8);
  cfd::core::Address::operator=((Address *)local_3d8,&local_ca0);
  cfd::core::Address::~Address(&local_ca0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_cb8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                (&local_e70,(Address *)local_3d8,(ConfidentialKey *)local_78);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)
                 &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_e70);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_e70);
    }
  }
  else {
    testing::Message::Message(&local_e78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x4b,
               "Expected: (address = ElementsConfidentialAddress(unblind_addr, key)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_e78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_e78);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_eb0,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e90,
             "\"CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o\"",
             "address.GetAddress().c_str()",
             "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o",
             pcVar2);
  std::__cxx11::string::~string((string *)&local_eb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e90);
  if (!bVar1) {
    testing::Message::Message(&local_eb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_eb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_eb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e90);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            (&local_f08,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_ef0,&local_f08);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ed0,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",pcVar2);
  std::__cxx11::string::~string((string *)&local_ef0);
  cfd::core::Pubkey::~Pubkey(&local_f08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed0);
  if (!bVar1) {
    testing::Message::Message(&local_f10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ed0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_f10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_f10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
  cfd::core::ElementsConfidentialAddress::GetHash
            (&local_f60,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_f48,&local_f60);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f28,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_f48);
  cfd::core::ByteData::~ByteData(&local_f60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f28);
  if (!bVar1) {
    testing::Message::Message(&local_f68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_f68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f28);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            (&local_1120,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_fa0,&local_1120);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f80,"\"2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",pcVar2);
  std::__cxx11::string::~string((string *)&local_fa0);
  cfd::core::Address::~Address(&local_1120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f80);
  if (!bVar1) {
    testing::Message::Message(&local_1128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_1128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f80);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_1168,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_1141 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_1168);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1140,&local_1141,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_1168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1140);
  if (!bVar1) {
    testing::Message::Message(&local_1170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_11.message_,(internal *)local_1140,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1178,&local_1170);
    testing::internal::AssertHelper::~AssertHelper(&local_1178);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1140);
  local_11ac = kElementsRegtest;
  local_11b0 = cfd::core::ElementsConfidentialAddress::GetNetType
                         ((ElementsConfidentialAddress *)
                          &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_11a8,"ElementsNetType::kElementsRegtest",
             "address.GetNetType()",&local_11ac,&local_11b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
  if (!bVar1) {
    testing::Message::Message(&local_11b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_11b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_11b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
  local_11d4 = kP2pkhAddress;
  local_11d8 = cfd::core::ElementsConfidentialAddress::GetAddressType
                         ((ElementsConfidentialAddress *)
                          &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_11d0,"ElementsAddressType::kP2pkhAddress",
             "address.GetAddressType()",&local_11d4,&local_11d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11d0);
  if (!bVar1) {
    testing::Message::Message(&local_11e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_11e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_11e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11d0);
  cfd::core::ElementsConfidentialAddress::GetLockingScript
            (&local_1250,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Script::GetHex_abi_cxx11_(&local_1218,&local_1250);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_11f8,"\"76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac\"",
             "address.GetLockingScript().GetHex().c_str()",
             "76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",pcVar2);
  std::__cxx11::string::~string((string *)&local_1218);
  cfd::core::Script::~Script(&local_1250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f8);
  if (!bVar1) {
    testing::Message::Message(&local_1258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &uc_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &uc_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1258);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &uc_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1298,
             "04d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16e50cd61e20eb14e59a0c763d9cda790becb868ceeb00e5f74da0d15ff8381534"
             ,(allocator *)((long)&gtest_msg.value + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1278,&local_1298);
  std::__cxx11::string::~string((string *)&local_1298);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffed58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffed58);
  if (bVar1) {
    local_12a9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&anon_var_0,(Address *)local_3d8,
                 (ConfidentialKey *)local_1278);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)
                 &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ElementsConfidentialAddress *)&anon_var_0);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&anon_var_0);
    }
    if ((local_12a9 & 1) != 0) goto LAB_004638ca;
    pcStack_12a8 = 
    "Expected: (address = ElementsConfidentialAddress(unblind_addr, uc_key)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1478);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)((long)&ca.address_.field_2 + 8),kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x62,pcStack_12a8);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)((long)&ca.address_.field_2 + 8),local_1478);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&ca.address_.field_2 + 8));
  testing::Message::~Message(local_1478);
LAB_004638ca:
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&gtest_ar_14.message_,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_1668,
             (ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_1688,(ElementsConfidentialAddress *)&gtest_ar_14.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1648,"address.GetAddress()","ca.GetAddress()",&local_1668,
             &local_1688);
  std::__cxx11::string::~string((string *)&local_1688);
  std::__cxx11::string::~string((string *)&local_1668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1648);
  if (!bVar1) {
    testing::Message::Message(&local_1690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1648);
    testing::internal::AssertHelper::AssertHelper
              (&local_1698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1698,&local_1690);
    testing::internal::AssertHelper::~AssertHelper(&local_1698);
    testing::Message::~Message(&local_1690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1648);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&gtest_ar_14.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_1278);
  cfd::core::Address::~Address((Address *)local_3d8);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_78);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2pkhAddress) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  ConfidentialKey key = ConfidentialKey(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16");
  ElementsConfidentialAddress address;
  Address unblind_addr;

  unblind_addr = Address(ElementsNetType::kLiquidV1, pubkey, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_STREQ("76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",
               address.GetLockingScript().GetHex().c_str());

  unblind_addr = Address(ElementsNetType::kElementsRegtest, pubkey, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_STREQ("76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",
               address.GetLockingScript().GetHex().c_str());

  // uncompress pubkey
  ConfidentialKey uc_key =
      ConfidentialKey(
          "04d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16e50cd61e20eb14e59a0c763d9cda790becb868ceeb00e5f74da0d15ff8381534");
  EXPECT_THROW((address = ElementsConfidentialAddress(unblind_addr, uc_key)),
               CfdException);

  // copy check
  ElementsConfidentialAddress ca(address);
  EXPECT_EQ(address.GetAddress(), ca.GetAddress());
}